

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmPFlusha<(moira::Instr)180,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 ext_00;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  ext_00 = dasmIncRead<2>(this,addr);
  if (((str->style->syntax != GNU) && (str->style->syntax != GNU_MIT)) ||
     (bVar2 = isValidExtMMU(this,PFLUSHA,DIPC,op,ext_00), bVar2)) {
    StrWriter::operator<<(str);
  }
  else {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)180,(moira::Mode)9,4>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmPFlusha(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{};
}